

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O2

double __thiscall perlin::noise(perlin *this,point3 *p)

{
  double *pdVar1;
  double dVar2;
  double __x;
  double __x_00;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  vec3 *pvVar10;
  int dj;
  long lVar11;
  long lVar12;
  uint uVar13;
  vec3 *__s;
  int di;
  long lVar14;
  vec3 c [2] [2] [2];
  vec3 local_f8 [8];
  
  dVar2 = p->e[0];
  __x = p->e[1];
  __x_00 = p->e[2];
  dVar5 = floor(dVar2);
  dVar6 = floor(__x);
  dVar7 = floor(__x_00);
  __s = local_f8;
  memset(__s,0,0xc0);
  for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
    uVar3 = this->perm_x[(int)lVar14 + (int)dVar5 & 0xff];
    pvVar10 = __s;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      uVar4 = this->perm_y[(int)lVar11 + (int)dVar6 & 0xff];
      uVar13 = (int)dVar7;
      for (lVar12 = 0; lVar12 != 0x30; lVar12 = lVar12 + 0x18) {
        uVar9 = this->perm_z[uVar13 & 0xff] ^ uVar4 ^ uVar3;
        *(double *)((long)pvVar10->e + lVar12 + 0x10) = this->randvec[(int)uVar9].e[2];
        dVar8 = this->randvec[(int)uVar9].e[1];
        pdVar1 = (double *)((long)pvVar10->e + lVar12);
        *pdVar1 = this->randvec[(int)uVar9].e[0];
        pdVar1[1] = dVar8;
        uVar13 = uVar13 + 1;
      }
      pvVar10 = pvVar10 + 2;
    }
    __s = __s + 4;
  }
  dVar2 = perlin_interp((vec3 (*) [2] [2])local_f8,dVar2 - dVar5,__x - dVar6,__x_00 - dVar7);
  return dVar2;
}

Assistant:

double noise(const point3& p) const {
        auto u = p.x() - std::floor(p.x());
        auto v = p.y() - std::floor(p.y());
        auto w = p.z() - std::floor(p.z());

        auto i = int(std::floor(p.x()));
        auto j = int(std::floor(p.y()));
        auto k = int(std::floor(p.z()));
        vec3 c[2][2][2];

        for (int di=0; di < 2; di++)
            for (int dj=0; dj < 2; dj++)
                for (int dk=0; dk < 2; dk++)
                    c[di][dj][dk] = randvec[
                        perm_x[(i+di) & 255] ^
                        perm_y[(j+dj) & 255] ^
                        perm_z[(k+dk) & 255]
                    ];

        return perlin_interp(c, u, v, w);
    }